

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::list<trompeloeil::side_effect_base<void_()>,_trompeloeil::delete_disposer>::~list
          (list<trompeloeil::side_effect_base<void_()>,_trompeloeil::delete_disposer> *this)

{
  list<trompeloeil::side_effect_base<void_()>,_trompeloeil::delete_disposer> *this_local;
  
  ~list(this);
  operator_delete(this);
  return;
}

Assistant:

list<T, Disposer>::~list()
  {
    auto i = this->begin();
    while (i != this->end())
    {
      auto p = i++;
      Disposer::dispose(&*p);
    }
  }